

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O1

int ssl_write_server_hello(mbedtls_ssl_context *ssl)

{
  byte *pbVar1;
  _func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *p_Var2;
  uchar *puVar3;
  mbedtls_ssl_handshake_params *pmVar4;
  mbedtls_ssl_session *pmVar5;
  size_t sVar6;
  _func_int_void_ptr_mbedtls_ssl_session_ptr *p_Var7;
  char cVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  byte bVar12;
  int iVar13;
  time_t tVar14;
  mbedtls_ssl_ciphersuite_t *pmVar15;
  mbedtls_cipher_info_t *pmVar16;
  size_t sVar17;
  int iVar18;
  uint uVar19;
  uchar *puVar20;
  char *pcVar21;
  byte *buf;
  uchar *puVar22;
  long lVar23;
  long lVar24;
  size_t sVar25;
  long lVar26;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar27;
  byte *local_50;
  uchar *local_48;
  uchar *local_40;
  size_t local_38;
  
  uVar27 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
             ,0x845,"=> write server hello");
  uVar19 = *(uint *)&ssl->conf->field_0x164;
  if (((uVar19 & 2) == 0) || (ssl->handshake->verify_cookie_len == '\0')) {
    if (ssl->conf->f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x854,"no RNG provided");
      return -0x7400;
    }
    puVar3 = ssl->out_msg;
    mbedtls_ssl_write_version(ssl->major_ver,ssl->minor_ver,uVar19 >> 1 & 1,puVar3 + 4);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x867,"server hello, chosen version: [%d:%d]",(ulong)puVar3[4],
               CONCAT44(uVar27,(uint)puVar3[5]));
    tVar14 = time((time_t *)0x0);
    uVar19 = (uint)tVar14;
    *(uint *)(puVar3 + 6) =
         uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x870,"server hello, current time: %lu",tVar14);
    iVar13 = (*ssl->conf->f_rng)(ssl->conf->p_rng,puVar3 + 10,0x1c);
    if (iVar13 != 0) {
      return iVar13;
    }
    pmVar4 = ssl->handshake;
    uVar9 = *(undefined8 *)(puVar3 + 6);
    uVar10 = *(undefined8 *)(puVar3 + 0xe);
    uVar11 = *(undefined8 *)(puVar3 + 0x1e);
    *(undefined8 *)(pmVar4->randbytes + 0x30) = *(undefined8 *)(puVar3 + 0x16);
    *(undefined8 *)(pmVar4->randbytes + 0x38) = uVar11;
    *(undefined8 *)(pmVar4->randbytes + 0x20) = uVar9;
    *(undefined8 *)(pmVar4->randbytes + 0x28) = uVar10;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x87f,"server hello, random bytes",puVar3 + 6,0x20);
    if (((ssl->handshake->resume == 0) && (ssl->renego_status == 0)) &&
       (ssl->session_negotiate->id_len != 0)) {
      p_Var7 = ssl->conf->f_get_cache;
      if ((p_Var7 != (_func_int_void_ptr_mbedtls_ssl_session_ptr *)0x0) &&
         (iVar13 = (*p_Var7)(ssl->conf->p_cache,ssl->session_negotiate), iVar13 == 0)) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0x88e,"session successfully restored from cache");
        ssl->handshake->resume = 1;
      }
    }
    if (ssl->handshake->resume == 0) {
      ssl->state = ssl->state + 1;
      tVar14 = time((time_t *)0x0);
      pmVar5 = ssl->session_negotiate;
      pmVar5->start = tVar14;
      if (ssl->handshake->new_session_ticket == 0) {
        pmVar5->id_len = 0x20;
        sVar25 = 0x20;
        iVar13 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar5->id,0x20);
        if (iVar13 != 0) {
          return iVar13;
        }
      }
      else {
        pmVar5->id[8] = '\0';
        pmVar5->id[9] = '\0';
        pmVar5->id[10] = '\0';
        pmVar5->id[0xb] = '\0';
        pmVar5->id[0xc] = '\0';
        pmVar5->id[0xd] = '\0';
        pmVar5->id[0xe] = '\0';
        pmVar5->id[0xf] = '\0';
        pmVar5->id[0x10] = '\0';
        pmVar5->id[0x11] = '\0';
        pmVar5->id[0x12] = '\0';
        pmVar5->id[0x13] = '\0';
        pmVar5->id[0x14] = '\0';
        pmVar5->id[0x15] = '\0';
        pmVar5->id[0x16] = '\0';
        pmVar5->id[0x17] = '\0';
        pmVar5->id_len = 0;
        pmVar5->id[0] = '\0';
        pmVar5->id[1] = '\0';
        pmVar5->id[2] = '\0';
        pmVar5->id[3] = '\0';
        pmVar5->id[4] = '\0';
        pmVar5->id[5] = '\0';
        pmVar5->id[6] = '\0';
        pmVar5->id[7] = '\0';
        pmVar5->id[0x18] = '\0';
        pmVar5->id[0x19] = '\0';
        pmVar5->id[0x1a] = '\0';
        pmVar5->id[0x1b] = '\0';
        pmVar5->id[0x1c] = '\0';
        pmVar5->id[0x1d] = '\0';
        pmVar5->id[0x1e] = '\0';
        pmVar5->id[0x1f] = '\0';
        sVar25 = 0;
      }
    }
    else {
      sVar25 = ssl->session_negotiate->id_len;
      ssl->state = 0xc;
      iVar13 = mbedtls_ssl_derive_keys(ssl);
      if (iVar13 != 0) {
        pcVar21 = "mbedtls_ssl_derive_keys";
        iVar18 = 0x8b7;
        goto LAB_00164f14;
      }
    }
    puVar3[0x26] = (uchar)ssl->session_negotiate->id_len;
    memcpy(puVar3 + 0x27,ssl->session_negotiate->id,ssl->session_negotiate->id_len);
    sVar6 = ssl->session_negotiate->id_len;
    local_38 = sVar6;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8c8,"server hello, session id len.: %d",sVar25);
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8c9,"server hello, session id",puVar3 + 0x27,sVar25);
    pcVar21 = "a";
    if (ssl->handshake->resume == 0) {
      pcVar21 = "no";
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8cb,"%s session has been resumed",pcVar21);
    puVar3[sVar6 + 0x27] = *(uchar *)((long)&ssl->session_negotiate->ciphersuite + 1);
    puVar3[sVar6 + 0x28] = (uchar)ssl->session_negotiate->ciphersuite;
    puVar3[sVar6 + 0x29] = (uchar)ssl->session_negotiate->compression;
    local_48 = puVar3 + sVar6 + 0x27;
    pcVar21 = mbedtls_ssl_get_ciphersuite_name(ssl->session_negotiate->ciphersuite);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8d2,"server hello, chosen ciphersuite: %s",pcVar21);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8d4,"server hello, compress alg.: 0x%02X",
               (ulong)(uint)ssl->session_negotiate->compression);
    sVar25 = local_38;
    puVar20 = puVar3 + local_38 + 0x2c;
    if (ssl->secure_renegotiation == 1) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x784,"server hello, secure renegotiation extension");
      puVar22 = local_48;
      local_48[5] = 0xff;
      local_48[6] = '\x01';
      iVar13 = ssl->renego_status;
      local_48[7] = '\0';
      if (iVar13 == 0) {
        local_48[8] = '\x01';
        local_48[9] = '\0';
        puVar22 = local_48 + 10;
      }
      else {
        local_48[8] = (char)ssl->verify_data_len * '\x02' + '\x01';
        local_48[9] = (char)ssl->verify_data_len * '\x02';
        memcpy(local_48 + 10,ssl->peer_verify_data,ssl->verify_data_len);
        sVar17 = ssl->verify_data_len;
        memcpy(puVar22 + sVar17 + 10,ssl->own_verify_data,sVar17);
        puVar22 = puVar22 + sVar17 + 10 + ssl->verify_data_len;
      }
      lVar23 = (long)puVar22 - (long)puVar20;
    }
    else {
      lVar23 = 0;
    }
    if (ssl->session_negotiate->mfl_code == '\0') {
      lVar26 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x7ad,"server hello, max_fragment_length extension");
      puVar22 = puVar20 + lVar23;
      puVar22[0] = '\0';
      puVar22[1] = '\x01';
      puVar22[2] = '\0';
      puVar22[3] = '\x01';
      puVar3[lVar23 + sVar25 + 0x30] = ssl->session_negotiate->mfl_code;
      lVar26 = 5;
    }
    if (ssl->session_negotiate->trunc_hmac == 0) {
      lVar24 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x70d,"server hello, adding truncated hmac extension");
      puVar22 = puVar20 + lVar26 + lVar23;
      puVar22[0] = '\0';
      puVar22[1] = '\x04';
      puVar22[2] = '\0';
      puVar22[3] = '\0';
      lVar24 = 4;
    }
    lVar24 = lVar24 + lVar26 + lVar23;
    if (((ssl->session_negotiate->encrypt_then_mac == 0) || (ssl->minor_ver == 0)) ||
       ((pmVar15 = mbedtls_ssl_ciphersuite_from_id(ssl->session_negotiate->ciphersuite),
        pmVar15 == (mbedtls_ssl_ciphersuite_t *)0x0 ||
        ((pmVar16 = mbedtls_cipher_info_from_type(pmVar15->cipher),
         pmVar16 == (mbedtls_cipher_info_t *)0x0 || (pmVar16->mode != MBEDTLS_MODE_CBC)))))) {
      lVar23 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x738,"server hello, adding encrypt then mac extension");
      puVar22 = puVar20 + lVar24;
      puVar22[0] = '\0';
      puVar22[1] = '\x16';
      puVar22[2] = '\0';
      puVar22[3] = '\0';
      lVar23 = 4;
    }
    lVar23 = lVar23 + lVar24;
    if ((ssl->handshake->extended_ms == 0) || (ssl->minor_ver == 0)) {
      lVar26 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x753,"server hello, adding extended master secret extension");
      puVar22 = puVar20 + lVar23;
      puVar22[0] = '\0';
      puVar22[1] = '\x17';
      puVar22[2] = '\0';
      puVar22[3] = '\0';
      lVar26 = 4;
    }
    lVar26 = lVar26 + lVar23;
    if (ssl->handshake->new_session_ticket == 0) {
      lVar23 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x76c,"server hello, adding session ticket extension");
      puVar22 = puVar20 + lVar26;
      puVar22[0] = '\0';
      puVar22[1] = '#';
      puVar22[2] = '\0';
      puVar22[3] = '\0';
      lVar23 = 4;
    }
    lVar23 = lVar23 + lVar26;
    local_40 = puVar20;
    if ((ssl->handshake->cli_exts & 1) == 0) {
      lVar26 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x7ca,"server hello, supported_point_formats extension");
      puVar20 = puVar20 + lVar23;
      puVar20[0] = '\0';
      puVar20[1] = '\v';
      puVar20[2] = '\0';
      puVar20[3] = '\x02';
      (puVar3 + lVar23 + sVar25 + 0x30)[0] = '\x01';
      (puVar3 + lVar23 + sVar25 + 0x30)[1] = '\0';
      lVar26 = 6;
    }
    lVar26 = lVar26 + lVar23;
    if (ssl->alpn_chosen == (char *)0x0) {
      lVar23 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x7e3,"server hello, adding alpn extension");
      puVar20 = local_40;
      puVar22 = local_40 + lVar26 + 7;
      puVar22[-7] = '\0';
      puVar22[-6] = '\x10';
      sVar17 = strlen(ssl->alpn_chosen);
      lVar23 = sVar17 + 7;
      puVar20[lVar26 + 2] = (uchar)((uint)((int)sVar17 + 3) >> 8);
      cVar8 = (char)lVar23;
      puVar22[-4] = cVar8 + 0xfc;
      puVar20[lVar26 + 4] = (uchar)((uint)((int)sVar17 + 1) >> 8);
      puVar22[-2] = cVar8 + 0xfa;
      puVar22[-1] = cVar8 + 0xf9;
      memcpy(puVar22,ssl->alpn_chosen,sVar17);
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8ff,"server hello, total extension length: %d",lVar23 + lVar26);
    lVar23 = lVar23 + lVar26;
    if (lVar23 == 0) {
      puVar20 = puVar3 + local_38 + 0x2a;
    }
    else {
      *(ushort *)(local_48 + 3) = (ushort)lVar23 << 8 | (ushort)lVar23 >> 8;
      puVar20 = local_40 + lVar23;
    }
    ssl->out_msglen = (long)puVar20 - (long)puVar3;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x02';
    iVar13 = mbedtls_ssl_write_record(ssl);
    pcVar21 = "<= write server hello";
    iVar18 = 0x90e;
LAB_00165528:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,iVar18,pcVar21);
  }
  else {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x84b,"client hello was not authenticated");
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x84c,"<= write server hello");
    local_50 = ssl->out_msg + 4;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x804,"=> write hello verify request");
    mbedtls_ssl_write_version
              (ssl->major_ver,ssl->minor_ver,*(uint *)&ssl->conf->field_0x164 >> 1 & 1,local_50);
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x811,"server version",local_50,2);
    pbVar1 = local_50 + 2;
    p_Var2 = ssl->conf->f_cookie_write;
    if (p_Var2 == (_func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *)0x0) {
      local_50 = pbVar1;
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x817,"inconsistent cookie callbacks");
      return -0x6c00;
    }
    buf = local_50 + 3;
    local_50 = buf;
    iVar13 = (*p_Var2)(ssl->conf->p_cookie,&local_50,ssl->out_buf + 0x414d,ssl->cli_id,
                       ssl->cli_id_len);
    if (iVar13 == 0) {
      bVar12 = (char)local_50 - (char)buf;
      *pbVar1 = bVar12;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x828,"cookie sent",buf,(ulong)bVar12);
      ssl->out_msglen = (long)local_50 - (long)ssl->out_msg;
      ssl->out_msgtype = 0x16;
      *ssl->out_msg = '\x03';
      ssl->state = 0x12;
      iVar13 = mbedtls_ssl_write_record(ssl);
      if (iVar13 == 0) {
        pcVar21 = "<= write hello verify request";
        iVar13 = 0;
        iVar18 = 0x836;
        goto LAB_00165528;
      }
      pcVar21 = "mbedtls_ssl_write_record";
      iVar18 = 0x832;
    }
    else {
      pcVar21 = "f_cookie_write";
      iVar18 = 0x822;
    }
LAB_00164f14:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,iVar18,pcVar21,iVar13);
  }
  return iVar13;
}

Assistant:

static int ssl_write_server_hello( mbedtls_ssl_context *ssl )
{
#if defined(MBEDTLS_HAVE_TIME)
    time_t t;
#endif
    int ret;
    size_t olen, ext_len = 0, n;
    unsigned char *buf, *p;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write server hello" ) );

#if defined(MBEDTLS_SSL_DTLS_HELLO_VERIFY)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake->verify_cookie_len != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "client hello was not authenticated" ) );
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write server hello" ) );

        return( ssl_write_hello_verify_request( ssl ) );
    }
#endif /* MBEDTLS_SSL_DTLS_HELLO_VERIFY */

    if( ssl->conf->f_rng == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "no RNG provided") );
        return( MBEDTLS_ERR_SSL_NO_RNG );
    }

    /*
     *     0  .   0   handshake type
     *     1  .   3   handshake length
     *     4  .   5   protocol version
     *     6  .   9   UNIX time()
     *    10  .  37   random bytes
     */
    buf = ssl->out_msg;
    p = buf + 4;

    mbedtls_ssl_write_version( ssl->major_ver, ssl->minor_ver,
                       ssl->conf->transport, p );
    p += 2;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, chosen version: [%d:%d]",
                        buf[4], buf[5] ) );

#if defined(MBEDTLS_HAVE_TIME)
    t = time( NULL );
    *p++ = (unsigned char)( t >> 24 );
    *p++ = (unsigned char)( t >> 16 );
    *p++ = (unsigned char)( t >>  8 );
    *p++ = (unsigned char)( t       );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, current time: %lu", t ) );
#else
    if( ( ret = ssl->conf->f_rng( ssl->conf->p_rng, p, 4 ) ) != 0 )
        return( ret );

    p += 4;
#endif /* MBEDTLS_HAVE_TIME */

    if( ( ret = ssl->conf->f_rng( ssl->conf->p_rng, p, 28 ) ) != 0 )
        return( ret );

    p += 28;

    memcpy( ssl->handshake->randbytes + 32, buf + 6, 32 );

    MBEDTLS_SSL_DEBUG_BUF( 3, "server hello, random bytes", buf + 6, 32 );

    /*
     * Resume is 0  by default, see ssl_handshake_init().
     * It may be already set to 1 by ssl_parse_session_ticket_ext().
     * If not, try looking up session ID in our cache.
     */
    if( ssl->handshake->resume == 0 &&
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        ssl->renego_status == MBEDTLS_SSL_INITIAL_HANDSHAKE &&
#endif
        ssl->session_negotiate->id_len != 0 &&
        ssl->conf->f_get_cache != NULL &&
        ssl->conf->f_get_cache( ssl->conf->p_cache, ssl->session_negotiate ) == 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "session successfully restored from cache" ) );
        ssl->handshake->resume = 1;
    }

    if( ssl->handshake->resume == 0 )
    {
        /*
         * New session, create a new session id,
         * unless we're about to issue a session ticket
         */
        ssl->state++;

#if defined(MBEDTLS_HAVE_TIME)
        ssl->session_negotiate->start = time( NULL );
#endif

#if defined(MBEDTLS_SSL_SESSION_TICKETS)
        if( ssl->handshake->new_session_ticket != 0 )
        {
            ssl->session_negotiate->id_len = n = 0;
            memset( ssl->session_negotiate->id, 0, 32 );
        }
        else
#endif /* MBEDTLS_SSL_SESSION_TICKETS */
        {
            ssl->session_negotiate->id_len = n = 32;
            if( ( ret = ssl->conf->f_rng( ssl->conf->p_rng, ssl->session_negotiate->id,
                                    n ) ) != 0 )
                return( ret );
        }
    }
    else
    {
        /*
         * Resuming a session
         */
        n = ssl->session_negotiate->id_len;
        ssl->state = MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC;

        if( ( ret = mbedtls_ssl_derive_keys( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_derive_keys", ret );
            return( ret );
        }
    }

    /*
     *    38  .  38     session id length
     *    39  . 38+n    session id
     *   39+n . 40+n    chosen ciphersuite
     *   41+n . 41+n    chosen compression alg.
     *   42+n . 43+n    extensions length
     *   44+n . 43+n+m  extensions
     */
    *p++ = (unsigned char) ssl->session_negotiate->id_len;
    memcpy( p, ssl->session_negotiate->id, ssl->session_negotiate->id_len );
    p += ssl->session_negotiate->id_len;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, session id len.: %d", n ) );
    MBEDTLS_SSL_DEBUG_BUF( 3,   "server hello, session id", buf + 39, n );
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "%s session has been resumed",
                   ssl->handshake->resume ? "a" : "no" ) );

    *p++ = (unsigned char)( ssl->session_negotiate->ciphersuite >> 8 );
    *p++ = (unsigned char)( ssl->session_negotiate->ciphersuite      );
    *p++ = (unsigned char)( ssl->session_negotiate->compression      );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, chosen ciphersuite: %s",
           mbedtls_ssl_get_ciphersuite_name( ssl->session_negotiate->ciphersuite ) ) );
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, compress alg.: 0x%02X",
                   ssl->session_negotiate->compression ) );

    /*
     *  First write extensions, then the total length
     */
    ssl_write_renegotiation_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;

#if defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH)
    ssl_write_max_fragment_length_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_TRUNCATED_HMAC)
    ssl_write_truncated_hmac_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
    ssl_write_encrypt_then_mac_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_EXTENDED_MASTER_SECRET)
    ssl_write_extended_ms_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_SESSION_TICKETS)
    ssl_write_session_ticket_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_ECDH_C) || defined(MBEDTLS_ECDSA_C)
    ssl_write_supported_point_formats_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_ALPN)
    ssl_write_alpn_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, total extension length: %d", ext_len ) );

    if( ext_len > 0 )
    {
        *p++ = (unsigned char)( ( ext_len >> 8 ) & 0xFF );
        *p++ = (unsigned char)( ( ext_len      ) & 0xFF );
        p += ext_len;
    }

    ssl->out_msglen  = p - buf;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_SERVER_HELLO;

    ret = mbedtls_ssl_write_record( ssl );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write server hello" ) );

    return( ret );
}